

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O1

void __thiscall
CLIntercept::injectBuffersForKernel
          (CLIntercept *this,uint64_t enqueueCounter,cl_kernel kernel,cl_command_queue command_queue
          )

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_color _Var2;
  uint uVar3;
  _Base_ptr p_Var4;
  pointer pcVar5;
  ulong __new_size;
  int iVar6;
  cl_int cVar7;
  cl_platform_id p_Var8;
  mapped_type *pmVar9;
  _Base_ptr p_Var10;
  _Base_ptr p_Var11;
  mapped_type *pmVar12;
  mapped_type *__k;
  iterator iVar13;
  long *plVar14;
  ulong uVar15;
  _Base_ptr p_Var16;
  mapped_type_conflict *pmVar17;
  _Rb_tree_header *p_Var18;
  _Rb_tree_header *p_Var19;
  mapped_type *pmVar20;
  void *pvVar21;
  undefined8 uVar22;
  mapped_type *pmVar23;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar24;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar25;
  float __x;
  float __x_00;
  float __x_01;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar26;
  void *allocation;
  cl_int error;
  cl_mem memobj;
  string prefix;
  vector<char,_std::allocator<char>_> transferBuf;
  string fileName;
  cl_context context;
  char tmpStr [256];
  _Base_ptr local_468;
  _Rb_tree_header *local_460;
  _Rb_tree_header *local_458;
  _Rb_tree_header *local_450;
  string local_448;
  cl_command_queue local_428;
  cl_platform_id local_420;
  _Base_ptr local_418;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_410;
  string local_408;
  vector<char,_std::allocator<char>_> local_3e8;
  pthread_mutex_t *local_3d0;
  CLdispatchXMap *local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  CBufferInfoMap *local_3a0;
  CSVMAllocInfoMap *local_398;
  CUSMAllocInfoMap *local_390;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_388;
  CKernelInfoMap *local_380;
  CMemAllocNumberMap *local_378;
  uint64_t local_370;
  _Rb_tree_node_base *local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  undefined1 local_340 [32];
  int aiStack_320 [122];
  allocator local_138 [264];
  
  local_3d0 = (pthread_mutex_t *)&this->m_Mutex;
  local_428 = command_queue;
  local_410 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)kernel;
  local_370 = enqueueCounter;
  iVar6 = pthread_mutex_lock(local_3d0);
  if (iVar6 != 0) {
    uVar22 = std::__throw_system_error(iVar6);
    std::ifstream::~ifstream(local_340);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
      operator_delete(local_3c0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._M_dataplus._M_p != &local_408.field_2) {
      operator_delete(local_408._M_dataplus._M_p);
    }
    if (local_3e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_3e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    pthread_mutex_unlock(local_3d0);
    _Unwind_Resume(uVar22);
  }
  local_340._0_8_ = (cl_context)0x0;
  (*(this->m_Dispatch).clGetKernelInfo)
            ((cl_kernel)local_410->_M_local_buf,0x1193,8,local_340,(size_t *)0x0);
  p_Var8 = getPlatform(this,(cl_context)local_340._0_8_);
  local_3e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_3e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_3e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
  local_408._M_string_length = 0;
  local_408.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)local_340,sc_DumpDirectoryName,local_138);
  OS::Services_Common::GetDumpDirectoryNameWithoutPid
            (&(this->m_OS).super_Services_Common,(string *)local_340,&local_408);
  if ((cl_context)local_340._0_8_ != (cl_context)(local_340 + 0x10)) {
    operator_delete((void *)local_340._0_8_);
  }
  std::__cxx11::string::append((char *)&local_408);
  local_420 = p_Var8;
  pmVar9 = std::
           map<_cl_kernel_*,_std::map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_std::map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>_>_>_>
           ::operator[](&this->m_KernelArgMemMap,(key_type *)&local_410);
  p_Var10 = (pmVar9->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var19 = &(pmVar9->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var10 != p_Var19) {
    local_390 = &this->m_USMAllocInfoMap;
    p_Var1 = &(this->m_USMAllocInfoMap)._M_t._M_impl.super__Rb_tree_header;
    local_450 = &(this->m_SVMAllocInfoMap)._M_t._M_impl.super__Rb_tree_header;
    local_460 = &(this->m_BufferInfoMap)._M_t._M_impl.super__Rb_tree_header;
    local_378 = &this->m_MemAllocNumberMap;
    local_380 = &this->m_KernelInfoMap;
    local_388 = &(this->m_LongKernelNameMap)._M_h;
    local_3c8 = &this->m_DispatchX;
    local_458 = &(this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header;
    local_398 = &this->m_SVMAllocInfoMap;
    local_3a0 = &this->m_BufferInfoMap;
    local_368 = &p_Var19->_M_header;
    do {
      _Var2 = p_Var10[1]._M_color;
      p_Var4 = p_Var10[1]._M_parent;
      local_468 = p_Var4;
      local_418 = p_Var4;
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
      p_Var16 = (this->m_USMAllocInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var11 = &p_Var1->_M_header;
      for (; (_Rb_tree_header *)p_Var16 != (_Rb_tree_header *)0x0;
          p_Var16 = (&p_Var16->_M_left)[*(_Base_ptr *)(p_Var16 + 1) < p_Var4]) {
        if (*(_Base_ptr *)(p_Var16 + 1) >= p_Var4) {
          p_Var11 = p_Var16;
        }
      }
      p_Var19 = p_Var1;
      if (((_Rb_tree_header *)p_Var11 != p_Var1) &&
         (p_Var19 = (_Rb_tree_header *)p_Var11,
         p_Var4 < (_Base_ptr)((_Rb_tree_header *)p_Var11)->_M_node_count)) {
        p_Var19 = p_Var1;
      }
      if (p_Var19 == p_Var1) {
        p_Var19 = local_450;
        for (p_Var16 = (this->m_SVMAllocInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header.
                       _M_parent; (_Rb_tree_header *)p_Var16 != (_Rb_tree_header *)0x0;
            p_Var16 = (&p_Var16->_M_left)[*(_Base_ptr *)(p_Var16 + 1) < p_Var4]) {
          if (*(_Base_ptr *)(p_Var16 + 1) >= p_Var4) {
            p_Var19 = (_Rb_tree_header *)p_Var16;
          }
        }
        p_Var18 = local_450;
        if ((p_Var19 != local_450) &&
           (p_Var18 = p_Var19, p_Var4 < (_Base_ptr)p_Var19->_M_node_count)) {
          p_Var18 = local_450;
        }
        if (p_Var18 != local_450) goto LAB_0018113c;
        p_Var19 = local_460;
        for (p_Var16 = (this->m_BufferInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header.
                       _M_parent; (_Rb_tree_header *)p_Var16 != (_Rb_tree_header *)0x0;
            p_Var16 = (&p_Var16->_M_left)[*(_Base_ptr *)(p_Var16 + 1) < p_Var4]) {
          if (*(_Base_ptr *)(p_Var16 + 1) >= p_Var4) {
            p_Var19 = (_Rb_tree_header *)p_Var16;
          }
        }
        p_Var18 = local_460;
        if ((p_Var19 != local_460) &&
           (p_Var18 = p_Var19, p_Var4 < (_Base_ptr)p_Var19->_M_node_count)) {
          p_Var18 = local_460;
        }
        if (p_Var18 != local_460) goto LAB_0018113c;
      }
      else {
LAB_0018113c:
        local_340._0_8_ = p_Var4;
        pmVar12 = std::
                  map<const_void_*,_unsigned_int,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_int>_>_>
                  ::operator[](local_378,(key_type *)local_340);
        uVar3 = *pmVar12;
        local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3c0,local_408._M_dataplus._M_p,
                   local_408._M_dataplus._M_p + local_408._M_string_length);
        snprintf((char *)local_138,0x100,"%04u",local_370);
        std::__cxx11::string::append((char *)&local_3c0);
        std::__cxx11::string::append((char *)&local_3c0);
        std::__cxx11::string::append((char *)&local_3c0);
        local_448._M_dataplus._M_p = (pointer)local_410;
        __k = std::
              map<_cl_kernel_*,_CLIntercept::SKernelInfo,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_CLIntercept::SKernelInfo>_>_>
              ::operator[](local_380,(key_type *)&local_448);
        iVar13 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(local_388,&__k->KernelName);
        pmVar23 = (mapped_type *)
                  ((long)iVar13.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                         ._M_cur + 0x28);
        if (iVar13.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
            ._M_cur == (__node_type *)0x0) {
          pmVar23 = __k;
        }
        local_340._0_8_ = local_340 + 0x10;
        pcVar5 = (pmVar23->KernelName)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_340,pcVar5,pcVar5 + (pmVar23->KernelName)._M_string_length);
        std::__cxx11::string::_M_append((char *)&local_3c0,local_340._0_8_);
        if ((cl_context)local_340._0_8_ != (cl_context)(local_340 + 0x10)) {
          operator_delete((void *)local_340._0_8_);
        }
        snprintf((char *)local_138,0x100,"%u",(ulong)_Var2);
        std::__cxx11::string::append((char *)&local_3c0);
        std::__cxx11::string::append((char *)&local_3c0);
        snprintf((char *)local_138,0x100,"%04u",(ulong)uVar3);
        std::__cxx11::string::append((char *)&local_3c0);
        std::__cxx11::string::append((char *)&local_3c0);
        std::__cxx11::string::append((char *)&local_3c0);
        std::ifstream::ifstream(local_340);
        std::ifstream::open(local_340,(_Ios_Openmode)local_3c0._M_dataplus._M_p);
        if (*(int *)((long)aiStack_320 + *(long *)(local_340._0_8_ + -0x18)) == 0) {
          std::operator+(&local_360,"Injecting buffer file: ",&local_3c0);
          plVar14 = (long *)std::__cxx11::string::append((char *)&local_360);
          local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
          paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar14 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar14 == paVar24) {
            uVar25 = *(undefined4 *)paVar24;
            uVar26 = *(undefined4 *)((long)plVar14 + 0x14);
            local_448.field_2._M_allocated_capacity = paVar24->_M_allocated_capacity;
            local_448.field_2._8_4_ = (undefined4)plVar14[3];
            local_448.field_2._12_4_ = *(undefined4 *)((long)plVar14 + 0x1c);
          }
          else {
            local_448.field_2._M_allocated_capacity = paVar24->_M_allocated_capacity;
            uVar25 = extraout_XMM0_Da;
            uVar26 = extraout_XMM0_Db;
            local_448._M_dataplus._M_p = (pointer)*plVar14;
          }
          local_448._M_string_length = plVar14[1];
          *plVar14 = (long)paVar24;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          log(this,(double)CONCAT44(uVar26,uVar25));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_448._M_dataplus._M_p != &local_448.field_2) {
            operator_delete(local_448._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_dataplus._M_p != &local_360.field_2) {
            operator_delete(local_360._M_dataplus._M_p);
          }
          std::istream::seekg((long)local_340,_S_beg);
          uVar15 = std::istream::tellg();
          std::istream::seekg((long)local_340,_S_beg);
          p_Var4 = (this->m_USMAllocInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var16 = &p_Var1->_M_header;
          for (; (_Rb_tree_header *)p_Var4 != (_Rb_tree_header *)0x0;
              p_Var4 = (&p_Var4->_M_left)[*(_Base_ptr *)(p_Var4 + 1) < local_468]) {
            if (*(_Base_ptr *)(p_Var4 + 1) >= local_468) {
              p_Var16 = p_Var4;
            }
          }
          p_Var19 = p_Var1;
          if (((_Rb_tree_header *)p_Var16 != p_Var1) &&
             (p_Var19 = (_Rb_tree_header *)p_Var16,
             local_468 < (_Base_ptr)((_Rb_tree_header *)p_Var16)->_M_node_count)) {
            p_Var19 = p_Var1;
          }
          if (p_Var19 == p_Var1) {
            p_Var19 = local_450;
            for (p_Var4 = (this->m_SVMAllocInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header.
                          _M_parent; (_Rb_tree_header *)p_Var4 != (_Rb_tree_header *)0x0;
                p_Var4 = (&p_Var4->_M_left)[*(_Base_ptr *)(p_Var4 + 1) < local_468]) {
              if (*(_Base_ptr *)(p_Var4 + 1) >= local_468) {
                p_Var19 = (_Rb_tree_header *)p_Var4;
              }
            }
            p_Var18 = local_450;
            if ((p_Var19 != local_450) &&
               (p_Var18 = p_Var19, local_468 < (_Base_ptr)p_Var19->_M_node_count)) {
              p_Var18 = local_450;
            }
            if (p_Var18 == local_450) {
              p_Var19 = local_460;
              for (p_Var4 = (this->m_BufferInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header.
                            _M_parent; (_Rb_tree_header *)p_Var4 != (_Rb_tree_header *)0x0;
                  p_Var4 = (&p_Var4->_M_left)[*(_Base_ptr *)(p_Var4 + 1) < local_418]) {
                if (*(_Base_ptr *)(p_Var4 + 1) >= local_418) {
                  p_Var19 = (_Rb_tree_header *)p_Var4;
                }
              }
              p_Var18 = local_460;
              if ((p_Var19 != local_460) &&
                 (p_Var18 = p_Var19, local_418 < (_Base_ptr)p_Var19->_M_node_count)) {
                p_Var18 = local_460;
              }
              if (p_Var18 != local_460) {
                pmVar17 = std::
                          map<_cl_mem_*,_unsigned_long,_std::less<_cl_mem_*>,_std::allocator<std::pair<_cl_mem_*const,_unsigned_long>_>_>
                          ::operator[](local_3a0,(key_type *)&local_418);
                if (*pmVar17 < uVar15) {
                  logf(this,__x_01);
                }
                else {
                  local_448._M_dataplus._M_p = local_448._M_dataplus._M_p & 0xffffffff00000000;
                  pvVar21 = (*(this->m_Dispatch).clEnqueueMapBuffer)
                                      (local_428,(cl_mem)local_418,1,4,0,*pmVar17,0,(cl_event *)0x0,
                                       (cl_event *)0x0,(cl_int *)&local_448);
                  if ((int)local_448._M_dataplus._M_p == 0) {
                    std::istream::read(local_340,(long)pvVar21);
                    (*(this->m_Dispatch).clEnqueueUnmapMemObject)
                              (local_428,(cl_mem)local_418,pvVar21,0,(cl_event *)0x0,(cl_event *)0x0
                              );
                  }
                }
              }
            }
            else {
              pmVar17 = std::
                        map<const_void_*,_unsigned_long,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_long>_>_>
                        ::operator[](local_398,&local_468);
              if (*pmVar17 < uVar15) {
                logf(this,__x_00);
              }
              else {
                cVar7 = (*(this->m_Dispatch).clEnqueueSVMMap)
                                  (local_428,1,4,local_468,*pmVar17,0,(cl_event *)0x0,
                                   (cl_event *)0x0);
                if (cVar7 == 0) {
                  std::istream::read(local_340,(long)local_468);
                  (*(this->m_Dispatch).clEnqueueSVMUnmap)
                            (local_428,local_468,0,(cl_event *)0x0,(cl_event *)0x0);
                }
              }
            }
          }
          else {
            pmVar17 = std::
                      map<const_void_*,_unsigned_long,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_long>_>_>
                      ::operator[](local_390,&local_468);
            __new_size = *pmVar17;
            if (__new_size < uVar15) {
              logf(this,__x);
            }
            else {
              p_Var19 = local_458;
              for (p_Var4 = (this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header._M_header.
                            _M_parent; (_Rb_tree_header *)p_Var4 != (_Rb_tree_header *)0x0;
                  p_Var4 = (&p_Var4->_M_left)[*(cl_platform_id *)(p_Var4 + 1) < local_420]) {
                if (*(cl_platform_id *)(p_Var4 + 1) >= local_420) {
                  p_Var19 = (_Rb_tree_header *)p_Var4;
                }
              }
              p_Var18 = local_458;
              if ((p_Var19 != local_458) &&
                 (p_Var18 = p_Var19, local_420 < (cl_platform_id)p_Var19->_M_node_count)) {
                p_Var18 = local_458;
              }
              if (p_Var18 == local_458) {
                local_448._M_dataplus._M_p = (pointer)0x0;
                pmVar20 = std::
                          map<_cl_platform_id_*,_CLdispatchX,_std::less<_cl_platform_id_*>,_std::allocator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>_>
                          ::at(local_3c8,(key_type *)&local_448);
              }
              else {
                pmVar20 = (mapped_type *)(p_Var18 + 1);
              }
              if (pmVar20->clEnqueueMemcpyINTEL ==
                  (_func_cl_int_cl_command_queue_cl_bool_void_ptr_void_ptr_size_t_cl_uint_cl_event_ptr_cl_event_ptr
                   *)0x0) {
                local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_448,"clEnqueueMemcpyINTEL","");
                getExtensionFunctionAddress(this,local_420,&local_448);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_448._M_dataplus._M_p != &local_448.field_2) {
                  operator_delete(local_448._M_dataplus._M_p);
                }
              }
              if ((ulong)((long)local_3e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)local_3e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_start) < __new_size) {
                std::vector<char,_std::allocator<char>_>::resize(&local_3e8,__new_size);
              }
              p_Var19 = local_458;
              for (p_Var4 = (this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header._M_header.
                            _M_parent; (_Rb_tree_header *)p_Var4 != (_Rb_tree_header *)0x0;
                  p_Var4 = (&p_Var4->_M_left)[*(cl_platform_id *)(p_Var4 + 1) < local_420]) {
                if (*(cl_platform_id *)(p_Var4 + 1) >= local_420) {
                  p_Var19 = (_Rb_tree_header *)p_Var4;
                }
              }
              p_Var18 = local_458;
              if ((p_Var19 != local_458) &&
                 (p_Var18 = p_Var19, local_420 < (cl_platform_id)p_Var19->_M_node_count)) {
                p_Var18 = local_458;
              }
              if (p_Var18 == local_458) {
                local_448._M_dataplus._M_p = (pointer)0x0;
                pmVar20 = std::
                          map<_cl_platform_id_*,_CLdispatchX,_std::less<_cl_platform_id_*>,_std::allocator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>_>
                          ::at(local_3c8,(key_type *)&local_448);
              }
              else {
                pmVar20 = (mapped_type *)(p_Var18 + 1);
              }
              if ((pmVar20->clEnqueueMemcpyINTEL !=
                   (_func_cl_int_cl_command_queue_cl_bool_void_ptr_void_ptr_size_t_cl_uint_cl_event_ptr_cl_event_ptr
                    *)0x0) &&
                 (__new_size <=
                  (ulong)((long)local_3e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)local_3e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_start))) {
                std::istream::read(local_340,
                                   (long)local_3e8.super__Vector_base<char,_std::allocator<char>_>.
                                         _M_impl.super__Vector_impl_data._M_start);
                (*pmVar20->clEnqueueMemcpyINTEL)
                          (local_428,1,local_468,
                           local_3e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start,__new_size,0,(cl_event *)0x0,
                           (cl_event *)0x0);
              }
            }
          }
        }
        std::ifstream::~ifstream(local_340);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
          operator_delete(local_3c0._M_dataplus._M_p);
        }
      }
    } while (p_Var10 != local_368);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._M_dataplus._M_p != &local_408.field_2) {
    operator_delete(local_408._M_dataplus._M_p);
  }
  if (local_3e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_3e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  pthread_mutex_unlock(local_3d0);
  return;
}

Assistant:

void CLIntercept::injectBuffersForKernel(
    const uint64_t enqueueCounter,
    cl_kernel kernel,
    cl_command_queue command_queue )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    cl_platform_id  platform = getPlatform(kernel);

    std::vector<char>   transferBuf;
    std::string prefix;

    OS().GetDumpDirectoryNameWithoutPid( sc_DumpDirectoryName, prefix );
    prefix += "/Inject/";

    CArgMemMap& kernelArgMemMap = m_KernelArgMemMap[ kernel ];
    CArgMemMap::iterator  i = kernelArgMemMap.begin();
    while( i != kernelArgMemMap.end() )
    {
        CLI_C_ASSERT( sizeof(void*) == sizeof(cl_mem) );

        cl_uint arg_index = (*i).first;
        void*   allocation = (void*)(*i).second;
        cl_mem  memobj = (cl_mem)allocation;

        ++i;

        if( ( m_USMAllocInfoMap.find( allocation ) != m_USMAllocInfoMap.end() ) ||
            ( m_SVMAllocInfoMap.find( allocation ) != m_SVMAllocInfoMap.end() ) ||
            ( m_BufferInfoMap.find( memobj ) != m_BufferInfoMap.end() ) )
        {
            unsigned int        number = m_MemAllocNumberMap[ memobj ];

            std::string fileName( prefix );
            char    tmpStr[ MAX_PATH ];

            // Add the enqueue count to file name
            {
                CLI_SPRINTF( tmpStr, MAX_PATH, "%04u",
                    (unsigned int)enqueueCounter );

                fileName += "Enqueue_";
                fileName += tmpStr;
            }

            // Add the kernel name to the file name
            {
                fileName += "_Kernel_";
                fileName += getShortKernelName(kernel);
            }

            // Add the arg number to the file name
            {
                CLI_SPRINTF( tmpStr, MAX_PATH, "%u", arg_index );

                fileName += "_Arg_";
                fileName += tmpStr;
            }

            // Add the buffer number to the file name
            {
                CLI_SPRINTF( tmpStr, MAX_PATH, "%04u", number );

                fileName += "_Buffer_";
                fileName += tmpStr;
            }

            // Add extension to file name
            {
                fileName += ".bin";
            }

            std::ifstream is;
            is.open( fileName.c_str(), std::ios::in | std::ios::binary );
            if( is.good() )
            {
                log("Injecting buffer file: " + fileName + "\n");

                size_t  fileSize = 0;
                is.seekg( 0, std::ios::end );
                fileSize = (size_t)is.tellg();
                is.seekg( 0, std::ios::beg );

                if( m_USMAllocInfoMap.find( allocation ) != m_USMAllocInfoMap.end() )
                {
                    size_t size = m_USMAllocInfoMap[ allocation ];
                    if( size < fileSize )
                    {
                        logf("Skipping injection: USM alloc size (%zu bytes) is less than file size (%zu bytes)!\n",
                            size, fileSize );
                    }
                    else
                    {
                        if( dispatchX(platform).clEnqueueMemcpyINTEL == NULL )
                        {
                            getExtensionFunctionAddress(
                                platform,
                                "clEnqueueMemcpyINTEL" );
                        }
                        if( transferBuf.size() < size )
                        {
                            transferBuf.resize(size);
                        }

                        const auto& dispatchX = this->dispatchX(platform);
                        if( dispatchX.clEnqueueMemcpyINTEL &&
                            transferBuf.size() >= size )
                        {
                            is.read( transferBuf.data(), size );

                            dispatchX.clEnqueueMemcpyINTEL(
                                command_queue,
                                CL_TRUE,
                                allocation,
                                transferBuf.data(),
                                size,
                                0,
                                NULL,
                                NULL );
                        }
                    }
                }
                else if( m_SVMAllocInfoMap.find( allocation ) != m_SVMAllocInfoMap.end() )
                {
                    size_t size = m_SVMAllocInfoMap[ allocation ];
                    if( size < fileSize )
                    {
                        logf("Skipping injection: SVM alloc size (%zu bytes) is less than file size (%zu bytes)!\n",
                            size, fileSize );
                    }
                    else
                    {
                        cl_int  error = dispatch().clEnqueueSVMMap(
                            command_queue,
                            CL_TRUE,
                            CL_MAP_WRITE_INVALIDATE_REGION,
                            allocation,
                            size,
                            0,
                            NULL,
                            NULL );
                        if( error == CL_SUCCESS )
                        {
                            is.read( (char*)allocation, size );

                            dispatch().clEnqueueSVMUnmap(
                                command_queue,
                                allocation,
                                0,
                                NULL,
                                NULL );
                        }
                    }
                }
                else if( m_BufferInfoMap.find( memobj ) != m_BufferInfoMap.end() )
                {
                    size_t size = m_BufferInfoMap[ memobj ];
                    if( size < fileSize )
                    {
                        logf("Skipping injection: buffer size (%zu bytes) is less than file size (%zu bytes)!\n",
                            size, fileSize );
                    }
                    else
                    {
                        cl_int  error = CL_SUCCESS;
                        void*   ptr = dispatch().clEnqueueMapBuffer(
                            command_queue,
                            memobj,
                            CL_TRUE,
                            CL_MAP_WRITE_INVALIDATE_REGION,
                            0,
                            size,
                            0,
                            NULL,
                            NULL,
                            &error );
                        if( error == CL_SUCCESS )
                        {
                            is.read( (char*)ptr, size );

                            dispatch().clEnqueueUnmapMemObject(
                                command_queue,
                                memobj,
                                ptr,
                                0,
                                NULL,
                                NULL );
                        }
                    }
                }
            }
        }
    }
}